

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O0

Gia_Man_t * Gia_ManUnrollDup(Gia_Man_t *p,Vec_Int_t *vLimit)

{
  int iVar1;
  Gia_Man_t *p_00;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vLimit_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vLimit);
  if (iVar1 != 0) {
    __assert_fail("Vec_IntSize(vLimit) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFrames.c"
                  ,0x70,"Gia_Man_t *Gia_ManUnrollDup(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  Gia_ManFillValue(p);
  pGVar3 = Gia_ManConst0(p);
  pGVar3->Value = 0;
  iVar1 = Gia_ManObjNum(p_00);
  Vec_IntPush(vLimit,iVar1);
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar4 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCo(p,local_2c);
      bVar4 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjId(p,pGStack_28);
    Gia_ManUnrollDup_rec(p_00,pGStack_28,iVar1);
    local_2c = local_2c + 1;
  }
  iVar1 = Gia_ManObjNum(p_00);
  Vec_IntPush(vLimit,iVar1);
  local_2c = 1;
  do {
    iVar1 = Gia_ManObjNum(p_00);
    if (iVar1 <= local_2c) {
      Gia_ManSetRegNum(p_00,0);
      return p_00;
    }
    iVar1 = Vec_IntEntryLast(vLimit);
    if (local_2c == iVar1) {
      iVar1 = Gia_ManObjNum(p_00);
      Vec_IntPush(vLimit,iVar1);
    }
    pGVar3 = Gia_ManObj(p_00,local_2c);
    pGVar3 = Gia_ManObj(p,pGVar3->Value);
    iVar1 = Gia_ObjIsRo(p,pGVar3);
    if (iVar1 != 0) {
      pGVar3 = Gia_ObjRoToRi(p,pGVar3);
      if (pGVar3->Value != 0xffffffff) {
        __assert_fail("!~pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFrames.c"
                      ,0x88,"Gia_Man_t *Gia_ManUnrollDup(Gia_Man_t *, Vec_Int_t *)");
      }
      iVar1 = Gia_ObjId(p,pGVar3);
      Gia_ManUnrollDup_rec(p_00,pGVar3,iVar1);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManUnrollDup( Gia_Man_t * p, Vec_Int_t * vLimit )  
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vLimit) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );

    // save constant class
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );
 
    // create first class
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManUnrollDup_rec( pNew, pObj, Gia_ObjId(p, pObj) );
    Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );

    // create next classes
    for ( i = 1; i < Gia_ManObjNum(pNew); i++ )
    {
        if ( i == Vec_IntEntryLast(vLimit) )
            Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );
        pObj = Gia_ManObj( p, Gia_ManObj(pNew, i)->Value );
        if ( Gia_ObjIsRo(p, pObj) )
        {
            pObj = Gia_ObjRoToRi(p, pObj);
            assert( !~pObj->Value );
            Gia_ManUnrollDup_rec( pNew, pObj, Gia_ObjId(p, pObj) );
        }
    }
    Gia_ManSetRegNum( pNew, 0 );
    return pNew;
}